

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::AndExpressionNode::BuildProgram
          (AndExpressionNode *this,Scope *scope,ostream *out)

{
  int iVar1;
  const_reference pvVar2;
  pointer pAVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong local_30;
  size_t i;
  int unique_id;
  ostream *out_local;
  Scope *scope_local;
  AndExpressionNode *this_local;
  
  pvVar2 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar2);
  (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
  sVar4 = std::
          vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
          ::size(&(this->super_ASTNodeBasic).children_);
  if (sVar4 != 1) {
    std::operator<<(out,"    bool\n");
    iVar1 = vpl::Scope::GetUnique(scope);
    for (local_30 = 1;
        sVar4 = std::
                vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                ::size(&(this->super_ASTNodeBasic).children_), local_30 < sVar4;
        local_30 = local_30 + 1) {
      poVar5 = std::operator<<(out,"    jz .L");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
      std::operator<<(poVar5,"_end\n");
      pvVar2 = std::
               vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
               ::operator[](&(this->super_ASTNodeBasic).children_,local_30);
      pAVar3 = std::
               unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
               ::operator->(pvVar2);
      (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
      std::operator<<(out,"    bool\n");
      std::operator<<(out,"    and\n");
      vpl::Scope::Pop(scope);
    }
    poVar5 = std::operator<<(out,"func .L");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    std::operator<<(poVar5,"_end\n");
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                if (children_.size() == 1) {
                    return;
                }
                out << "    bool\n";
                int unique_id = scope->GetUnique();
                for (size_t i = 1; i < children_.size(); ++i) {
                    out << "    jz .L" << unique_id << "_end\n";
                    children_[i]->BuildProgram(scope, out);
                    out << "    bool\n";
                    out << "    and\n";
                    scope->Pop();
                }
                out << "func .L" << unique_id << "_end\n";
            }